

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream * QtPrivate::writeSequentialContainer<QList<QUrl>>(QDataStream *s,QList<QUrl> *c)

{
  bool bVar1;
  const_iterator o;
  QUrl *pQVar2;
  QList<QUrl> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  value_type *t;
  QList<QUrl> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  QDataStream *in_stack_ffffffffffffffa8;
  QDataStream *this;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QList<QUrl>::size(in_RSI);
  bVar1 = QDataStream::writeQSizeType(in_stack_ffffffffffffffa8,0x779541);
  if (bVar1) {
    local_10.i = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QUrl>::begin((QList<QUrl> *)this);
    o = QList<QUrl>::end((QList<QUrl> *)this);
    while (bVar1 = QList<QUrl>::const_iterator::operator!=(&local_10,o), bVar1) {
      pQVar2 = QList<QUrl>::const_iterator::operator*(&local_10);
      ::operator<<(in_RDI,(QUrl *)pQVar2);
      QList<QUrl>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}